

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateMetadataPragma
          (FileGenerator *this,Printer *p,string_view info_path)

{
  long lVar1;
  allocator<char> local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  string_view info_path_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  Sub local_258 [3];
  
  info_path_local._M_str = info_path._M_str;
  info_path_local._M_len = info_path._M_len;
  if (((info_path_local._M_len != 0) &&
      ((this->options_).annotation_pragma_name._M_string_length != 0)) &&
     ((this->options_).annotation_guard_name._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"guard",&local_2e9);
    io::Printer::Sub::Sub<std::__cxx11::string&>
              (local_258,&local_278,&(this->options_).annotation_guard_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"pragma",&local_2ea);
    io::Printer::Sub::Sub<std::__cxx11::string&>
              (local_258 + 1,&local_298,&(this->options_).annotation_pragma_name);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"info_path",&local_2eb);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_2d8,&info_path_local,&local_2ec);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_258 + 2,&local_2b8,&local_2d8);
    google::protobuf::io::Printer::Emit
              (p,local_258,3,0x60,
               "\n        #ifdef $guard$\n        #pragma $pragma$ \"$info_path$\"\n        #endif  // $guard$\n      "
              );
    lVar1 = 0x170;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_258[0].key_._M_dataplus._M_p + lVar1));
      lVar1 = lVar1 + -0xb8;
    } while (lVar1 != -0xb8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
  }
  return;
}

Assistant:

void FileGenerator::GenerateMetadataPragma(io::Printer* p,
                                           absl::string_view info_path) {
  if (info_path.empty() || options_.annotation_pragma_name.empty() ||
      options_.annotation_guard_name.empty()) {
    return;
  }

  p->Emit(
      {
          {"guard", options_.annotation_guard_name},
          {"pragma", options_.annotation_pragma_name},
          {"info_path", std::string(info_path)},
      },
      R"(
        #ifdef $guard$
        #pragma $pragma$ "$info_path$"
        #endif  // $guard$
      )");
}